

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::DoLoadClusterUnknownSize(Segment *this,longlong *pos,long *len)

{
  long lVar1;
  longlong lVar2;
  longlong size;
  longlong start;
  long status;
  long *len_local;
  longlong *pos_local;
  Segment *this_local;
  
  if ((this->m_pos < 0) && (this->m_pUnknownSize != (Cluster *)0x0)) {
    this_local = (Segment *)Cluster::Parse(this->m_pUnknownSize,pos,len);
    if (-1 < (long)this_local) {
      if (this_local == (Segment *)0x0) {
        this_local = (Segment *)0x2;
      }
      else {
        lVar1 = this->m_pUnknownSize->m_element_start;
        lVar2 = Cluster::GetElementSize(this->m_pUnknownSize);
        if (lVar2 < 0) {
          this_local = (Segment *)0xfffffffffffffffe;
        }
        else {
          *pos = lVar1 + lVar2;
          this->m_pos = *pos;
          this->m_pUnknownSize = (Cluster *)0x0;
          this_local = (Segment *)0x2;
        }
      }
    }
  }
  else {
    this_local = (Segment *)0xffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

long Segment::DoLoadClusterUnknownSize(long long& pos, long& len) {
  if (m_pos >= 0 || m_pUnknownSize == NULL)
    return E_PARSE_FAILED;

  const long status = m_pUnknownSize->Parse(pos, len);

  if (status < 0)  // error or underflow
    return status;

  if (status == 0)  // parsed a block
    return 2;  // continue parsing

  const long long start = m_pUnknownSize->m_element_start;
  const long long size = m_pUnknownSize->GetElementSize();

  if (size < 0)
    return E_FILE_FORMAT_INVALID;

  pos = start + size;
  m_pos = pos;

  m_pUnknownSize = 0;

  return 2;  // continue parsing
}